

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Stress::LongShaderCompileStressCase::iterate(LongShaderCompileStressCase *this)

{
  int *piVar1;
  string *psVar2;
  undefined1 *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  deUint32 dVar5;
  pointer piVar6;
  iterator __position;
  pointer pcVar7;
  iterator __last;
  LongShaderGenerator *pLVar8;
  LongShaderCompileStressCase *pLVar9;
  undefined8 *puVar10;
  _Rb_tree_node_base *p_Var11;
  long *plVar12;
  LongShaderCompileStressCase *in_RCX;
  undefined8 *puVar13;
  long *plVar14;
  string **ppsVar15;
  size_t siglen;
  int iVar16;
  ulong uVar17;
  char *pcVar18;
  uchar *sig;
  deUint32 dVar19;
  _Self __tmp;
  long lVar20;
  uint numItems;
  string *psVar21;
  undefined8 uVar22;
  char *pcVar23;
  float fVar24;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *in_R8;
  size_t in_R9;
  float fVar25;
  int iVar26;
  bool bVar27;
  bool bVar28;
  string varName_1;
  size_type __dnew;
  string outName;
  string expr;
  string varName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inNames;
  string local_3e0;
  LongShaderGenerator *local_3c0;
  float local_3b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string **local_390;
  long local_388;
  string *local_380;
  undefined8 uStack_378;
  undefined1 local_370 [32];
  _Rb_tree_node_base *local_350;
  size_t local_348;
  LongShaderCompileStressCase *local_340;
  string local_338;
  undefined1 *local_318;
  undefined8 local_310;
  undefined1 local_308;
  undefined7 uStack_307;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2d8;
  ShaderType local_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [96];
  ios_base local_258 [264];
  TestLog *local_150;
  ulong local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  ShaderType local_128 [2];
  value_type local_120;
  ProgramSources local_100;
  
  local_150 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_2cc = this->m_shaderType;
  bVar27 = local_2cc == SHADERTYPE_VERTEX;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_100,0,0xac);
  if ((this->m_gen).m_source._M_string_length == 0) {
    local_3c0 = &this->m_gen;
    (this->m_gen).m_source._M_string_length = 0;
    *(this->m_gen).m_source._M_dataplus._M_p = '\0';
    local_2b8._0_2_ = 0x7623;
    local_2b8._2_2_ = 0x7265;
    local_2b8[4] = 's';
    local_2b8._5_2_ = 0x6f69;
    local_2b8[7] = 'n';
    local_2b8._8_7_ = 0x73652030303320;
    local_2c8._8_8_ = (pointer)0xf;
    local_2b8[0xf] = '\0';
    local_2c8._0_8_ = local_2b8;
    Stress::anon_unknown_0::LongShaderGenerator::addLine(local_3c0,(string *)local_2c8);
    if ((undefined1 *)local_2c8._0_8_ != local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT17(local_2b8[7],
                               CONCAT25(local_2b8._5_2_,
                                        CONCAT14(local_2b8[4],
                                                 CONCAT22(local_2b8._2_2_,local_2b8._0_2_)))) + 1);
    }
    if ((this->m_gen).m_spec.shaderType == SHADERTYPE_FRAGMENT) {
      local_370._0_8_ = (pointer)0x32;
      local_2c8._0_8_ = local_2b8;
      local_2c8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_2c8,(ulong)local_370);
      local_2b8._0_2_ = (undefined2)local_370._0_8_;
      local_2b8._2_2_ = SUB82(local_370._0_8_,2);
      local_2b8[4] = SUB81(local_370._0_8_,4);
      local_2b8._5_2_ = SUB82(local_370._0_8_,5);
      local_2b8[7] = SUB81(local_370._0_8_,7);
      builtin_strncpy((char *)local_2c8._0_8_,"layout(location = 0) out mediump vec4 o_fragColor;",
                      0x32);
      local_2c8._8_8_ = local_370._0_8_;
      *(char *)(local_2c8._0_8_ + local_370._0_8_) = '\0';
      Stress::anon_unknown_0::LongShaderGenerator::addLine(local_3c0,(string *)local_2c8);
      if ((undefined1 *)local_2c8._0_8_ != local_2b8) {
        operator_delete((void *)local_2c8._0_8_,
                        CONCAT17(local_2b8[7],
                                 CONCAT25(local_2b8._5_2_,
                                          CONCAT14(local_2b8[4],
                                                   CONCAT22(local_2b8._2_2_,local_2b8._0_2_)))) + 1)
        ;
      }
    }
    local_370._0_8_ = (long *)0x10;
    local_2c8._0_8_ = local_2b8;
    local_2c8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_2c8,(ulong)local_370);
    local_2b8._0_2_ = (undefined2)local_370._0_8_;
    local_2b8._2_2_ = SUB82(local_370._0_8_,2);
    local_2b8[4] = SUB81(local_370._0_8_,4);
    local_2b8._5_2_ = SUB82(local_370._0_8_,5);
    local_2b8[7] = SUB81(local_370._0_8_,7);
    builtin_strncpy((char *)local_2c8._0_8_,"void main (void)",0x10);
    local_2c8._8_8_ = local_370._0_8_;
    *(char *)(local_2c8._0_8_ + local_370._0_8_) = '\0';
    Stress::anon_unknown_0::LongShaderGenerator::addLine(local_3c0,(string *)local_2c8);
    if ((undefined1 *)local_2c8._0_8_ != local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT17(local_2b8[7],
                               CONCAT25(local_2b8._5_2_,
                                        CONCAT14(local_2b8[4],
                                                 CONCAT22(local_2b8._2_2_,local_2b8._0_2_)))) + 1);
    }
    local_370._24_8_ = local_370 + 8;
    local_370._8_8_ = (ulong)(uint)local_370._12_4_ << 0x20;
    local_370._16_8_ = (_Base_ptr)0x0;
    local_348 = 0;
    local_2b8._0_2_ = 0x7b;
    local_2c8._8_8_ = &DAT_00000001;
    local_350 = (_Rb_tree_node_base *)local_370._24_8_;
    local_2c8._0_8_ = local_2b8;
    Stress::anon_unknown_0::LongShaderGenerator::addLine(local_3c0,(string *)local_2c8);
    if ((undefined1 *)local_2c8._0_8_ != local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT17(local_2b8[7],
                               CONCAT25(local_2b8._5_2_,
                                        CONCAT14(local_2b8[4],
                                                 CONCAT22(local_2b8._2_2_,local_2b8._0_2_)))) + 1);
    }
    iVar26 = (this->m_gen).m_nameGen.m_currentScopeDepth;
    iVar16 = iVar26 + 1;
    (this->m_gen).m_nameGen.m_currentScopeDepth = iVar16;
    piVar6 = (this->m_gen).m_nameGen.m_scopeIndices.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         (this->m_gen).m_nameGen.m_scopeIndices.super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)__position._M_current - (long)piVar6 >> 2) < (ulong)(long)iVar16) {
      local_2c8._0_8_ = local_2c8._0_8_ & 0xffffffff00000000;
      if (__position._M_current ==
          (this->m_gen).m_nameGen.m_scopeIndices.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&(this->m_gen).m_nameGen.m_scopeIndices,__position,(int *)local_2c8);
      }
      else {
        *__position._M_current = 0;
        (this->m_gen).m_nameGen.m_scopeIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl
        .super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    else {
      piVar1 = piVar6 + iVar26;
      *piVar1 = *piVar1 + 1;
    }
    (this->m_gen).m_nameGen.m_variableIndex = 0;
    local_3b4 = (float)(this->m_gen).m_spec.variablesPerBlock;
    local_340 = this;
    if (local_3b4 != 0.0) {
      fVar25 = 0.0;
      do {
        piVar1 = &(this->m_gen).m_nameGen.m_variableIndex;
        *piVar1 = *piVar1 + 1;
        local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
        local_3e0._M_string_length = 0;
        local_3e0.field_2._M_allocated_capacity =
             local_3e0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if (0 < (this->m_gen).m_nameGen.m_currentScopeDepth) {
          iVar26 = 0;
          do {
            std::__cxx11::string::push_back((char)&local_3e0);
            iVar26 = iVar26 + 1;
          } while (iVar26 < (local_340->m_gen).m_nameGen.m_currentScopeDepth);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
        this = local_340;
        std::ostream::operator<<
                  ((ostringstream *)local_2c8,(local_340->m_gen).m_nameGen.m_variableIndex);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
        std::ios_base::~ios_base(local_258);
        uVar22 = (string *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
          uVar22 = local_3e0.field_2._M_allocated_capacity;
        }
        psVar2 = (string *)((long)&((_Alloc_hider *)local_3e0._M_string_length)->_M_p + local_388);
        in_R8 = (string *)local_3e0._M_string_length;
        if ((ulong)uVar22 < psVar2) {
          psVar21 = (string *)0xf;
          if (local_390 != &local_380) {
            psVar21 = local_380;
          }
          if (psVar21 < psVar2) goto LAB_013c5e8a;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_390,0,(char *)0x0,(ulong)local_3e0._M_dataplus._M_p);
        }
        else {
LAB_013c5e8a:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_390);
        }
        local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_3b0.field_2._M_allocated_capacity = *puVar13;
          local_3b0.field_2._8_8_ = puVar10[3];
        }
        else {
          local_3b0.field_2._M_allocated_capacity = *puVar13;
          local_3b0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_3b0._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)puVar13 = 0;
        if (local_390 != &local_380) {
          operator_delete(local_390,(ulong)(local_380 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
          operator_delete(local_3e0._M_dataplus._M_p,
                          (ulong)(local_3e0.field_2._M_allocated_capacity + 1));
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_370,&local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p,
                          (ulong)(local_3b0.field_2._M_allocated_capacity + 1));
        }
        fVar25 = (float)((int)fVar25 + 1);
      } while (fVar25 != local_3b4);
    }
    std::
    vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back(&(this->m_gen).m_scopes,(value_type *)local_370);
    if ((_Rb_tree_node_base *)local_370._24_8_ != (_Rb_tree_node_base *)(local_370 + 8)) {
      paVar4 = &local_3b0.field_2;
      local_2d8 = &(local_340->m_gen).m_varNames;
      p_Var11 = (_Rb_tree_node_base *)local_370._24_8_;
      do {
        local_2c8._0_8_ = local_2b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2c8,*(long *)(p_Var11 + 1),
                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
        local_3b4 = deRandom_getFloat((deRandom *)local_3c0);
        std::operator+(&local_2f8,"mediump float ",(value_type *)local_2c8);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_3b0.field_2._M_allocated_capacity = *puVar13;
          local_3b0.field_2._8_8_ = puVar10[3];
          local_3b0._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_3b0.field_2._M_allocated_capacity = *puVar13;
          local_3b0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_3b0._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        de::floatToString_abi_cxx11_(&local_338,(de *)0x5,local_3b4,(int)local_3b0._M_string_length)
        ;
        uVar22 = (undefined1 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != paVar4) {
          uVar22 = local_3b0.field_2._M_allocated_capacity;
        }
        puVar3 = (undefined1 *)
                 ((long)&((_Alloc_hider *)local_3b0._M_string_length)->_M_p +
                 local_338._M_string_length);
        in_R8 = (string *)local_3b0._M_string_length;
        if ((ulong)uVar22 < puVar3) {
          uVar22 = (undefined1 *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != &local_338.field_2) {
            uVar22 = local_338.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar22 < puVar3) goto LAB_013c60bb;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_338,0,(char *)0x0,(ulong)local_3b0._M_dataplus._M_p);
        }
        else {
LAB_013c60bb:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_3b0,(ulong)local_338._M_dataplus._M_p);
        }
        ppsVar15 = (string **)(puVar10 + 2);
        if ((string **)*puVar10 == ppsVar15) {
          local_380 = *ppsVar15;
          uStack_378 = puVar10[3];
          local_390 = &local_380;
        }
        else {
          local_380 = *ppsVar15;
          local_390 = (string **)*puVar10;
        }
        local_388 = puVar10[1];
        *puVar10 = ppsVar15;
        puVar10[1] = 0;
        *(undefined1 *)ppsVar15 = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_390);
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_3e0.field_2._M_allocated_capacity = *puVar13;
          local_3e0.field_2._8_8_ = puVar10[3];
          local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
        }
        else {
          local_3e0.field_2._M_allocated_capacity = *puVar13;
          local_3e0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_3e0._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        Stress::anon_unknown_0::LongShaderGenerator::addLine(local_3c0,&local_3e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
          operator_delete(local_3e0._M_dataplus._M_p,
                          (ulong)(local_3e0.field_2._M_allocated_capacity + 1));
        }
        if (local_390 != &local_380) {
          operator_delete(local_390,(ulong)(local_380 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,
                          (ulong)(local_338.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != paVar4) {
          operator_delete(local_3b0._M_dataplus._M_p,
                          (ulong)(local_3b0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_2d8,(value_type *)local_2c8);
        if ((undefined1 *)local_2c8._0_8_ != local_2b8) {
          operator_delete((void *)local_2c8._0_8_,
                          CONCAT17(local_2b8[7],
                                   CONCAT25(local_2b8._5_2_,
                                            CONCAT14(local_2b8[4],
                                                     CONCAT22(local_2b8._2_2_,local_2b8._0_2_)))) +
                          1);
        }
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while (p_Var11 != (_Rb_tree_node_base *)(local_370 + 8));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_370);
    fVar25 = (float)(local_340->m_gen).m_spec.opsTotal;
    if (fVar25 != 0.0) {
      paVar4 = &local_3e0.field_2;
      uVar17 = 0;
      do {
        dVar5 = (local_340->m_gen).m_spec.opsPerExpression;
        fVar24 = (float)(dVar5 + (int)uVar17);
        dVar19 = (int)fVar25 - (int)uVar17;
        local_2d8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(local_2d8._4_4_,fVar24);
        local_3b4 = fVar25;
        local_148 = uVar17;
        if ((uint)fVar24 < (uint)fVar25) {
          de::Random::
          choose<std::__cxx11::string,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (&local_338,&local_3c0->m_rnd,
                     (local_340->m_gen).m_varNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (local_340->m_gen).m_varNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          dVar19 = dVar5;
        }
        else {
          bVar28 = (local_340->m_gen).m_spec.shaderType == SHADERTYPE_VERTEX;
          pcVar23 = "o_fragColor";
          if (bVar28) {
            pcVar23 = "gl_Position";
          }
          local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
          pcVar18 = "";
          if (bVar28) {
            pcVar18 = "";
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,pcVar23,pcVar18);
        }
        numItems = dVar19 + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_140,(long)(int)numItems,(allocator_type *)local_2c8);
        in_R8 = (string *)(ulong)numItems;
        de::Random::
        choose<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (&local_3c0->m_rnd,
                   (local_340->m_gen).m_varNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (local_340->m_gen).m_varNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )local_140.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,numItems);
        local_2c8._0_8_ = local_2b8;
        local_2b8._0_2_ = 0x2d2b;
        local_2b8._2_2_ = 0x2f2a;
        local_2c8._8_8_ = &DAT_00000004;
        local_2b8[4] = '\0';
        local_318 = &local_308;
        local_310 = 0;
        local_308 = 0;
        std::__cxx11::string::_M_assign((string *)&local_318);
        if (0 < (int)dVar19) {
          iVar26 = 1;
          do {
            local_3e0._M_string_length = 0;
            local_3e0.field_2._M_allocated_capacity =
                 local_3e0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_390 = (string **)((ulong)local_390 & 0xffffffffffffff00);
            local_3e0._M_dataplus._M_p = (pointer)paVar4;
            de::Random::choose<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char*>
                      (&local_3c0->m_rnd,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_2c8._0_8_,(char *)(local_2c8._8_8_ + local_2c8._0_8_),
                       (char *)&local_390,1);
            plVar12 = (long *)std::__cxx11::string::_M_replace_aux
                                        ((ulong)&local_3e0,local_3e0._M_string_length,0,'\x01');
            local_370._0_8_ = local_370 + 0x10;
            plVar14 = plVar12 + 2;
            if ((long *)*plVar12 == plVar14) {
              local_370._16_8_ = *plVar14;
              local_370._24_8_ = plVar12[3];
            }
            else {
              local_370._16_8_ = *plVar14;
              local_370._0_8_ = (long *)*plVar12;
            }
            local_370._8_8_ = plVar12[1];
            *plVar12 = (long)plVar14;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0._M_dataplus._M_p != paVar4) {
              operator_delete(local_3e0._M_dataplus._M_p,
                              (ulong)(local_3e0.field_2._M_allocated_capacity + 1));
            }
            pcVar7 = local_140.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar26]._M_dataplus._M_p;
            in_R8 = &local_3e0;
            local_3e0._M_dataplus._M_p = (pointer)paVar4;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_3e0,pcVar7,
                       pcVar7 + local_140.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar26]._M_string_length);
            std::operator+(&local_2f8," ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_370);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
            local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
            puVar13 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_3b0.field_2._M_allocated_capacity = *puVar13;
              local_3b0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_3b0.field_2._M_allocated_capacity = *puVar13;
              local_3b0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_3b0._M_string_length = puVar10[1];
            *puVar10 = puVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_3b0,(ulong)local_3e0._M_dataplus._M_p);
            local_390 = &local_380;
            ppsVar15 = (string **)(puVar10 + 2);
            if ((string **)*puVar10 == ppsVar15) {
              local_380 = *ppsVar15;
              uStack_378 = puVar10[3];
            }
            else {
              local_380 = *ppsVar15;
              local_390 = (string **)*puVar10;
            }
            local_388 = puVar10[1];
            *puVar10 = ppsVar15;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_390);
            if (local_390 != &local_380) {
              operator_delete(local_390,(ulong)(local_380 + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
              operator_delete(local_3b0._M_dataplus._M_p,
                              (ulong)(local_3b0.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0._M_dataplus._M_p != paVar4) {
              operator_delete(local_3e0._M_dataplus._M_p,
                              (ulong)(local_3e0.field_2._M_allocated_capacity + 1));
            }
            if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
              operator_delete((void *)local_370._0_8_,(ulong)(local_370._16_8_ + 1));
            }
            iVar26 = iVar26 + 1;
          } while (iVar26 <= (int)dVar19);
        }
        if ((undefined1 *)local_2c8._0_8_ != local_2b8) {
          operator_delete((void *)local_2c8._0_8_,
                          CONCAT17(local_2b8[7],
                                   CONCAT25(local_2b8._5_2_,
                                            CONCAT14(local_2b8[4],
                                                     CONCAT22(local_2b8._2_2_,local_2b8._0_2_)))) +
                          1);
        }
        if ((uint)local_2d8._0_4_ < (uint)local_3b4) {
          local_3e0._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3e0,local_338._M_dataplus._M_p,
                     local_338._M_dataplus._M_p + local_338._M_string_length);
          std::__cxx11::string::append((char *)&local_3e0);
          plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_318);
          local_370._0_8_ = local_370 + 0x10;
          plVar14 = plVar12 + 2;
          if ((long *)*plVar12 == plVar14) {
            local_370._16_8_ = *plVar14;
            local_370._24_8_ = plVar12[3];
          }
          else {
            local_370._16_8_ = *plVar14;
            local_370._0_8_ = (long *)*plVar12;
          }
          local_370._8_8_ = plVar12[1];
          *plVar12 = (long)plVar14;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append(local_370);
          local_2c8._0_8_ = local_2b8;
          pcVar23 = (char *)(puVar10 + 2);
          if ((char *)*puVar10 == pcVar23) {
            uVar22 = *(undefined8 *)pcVar23;
            local_2b8._0_2_ = (undefined2)uVar22;
            local_2b8._2_2_ = (undefined2)((ulong)uVar22 >> 0x10);
            local_2b8[4] = (undefined1)((ulong)uVar22 >> 0x20);
            local_2b8._5_2_ = (undefined2)((ulong)uVar22 >> 0x28);
            local_2b8[7] = (undefined1)((ulong)uVar22 >> 0x38);
            local_2b8._8_7_ = (undefined7)puVar10[3];
            local_2b8[0xf] = (undefined1)((ulong)puVar10[3] >> 0x38);
          }
          else {
            uVar22 = *(undefined8 *)pcVar23;
            local_2b8._0_2_ = (undefined2)uVar22;
            local_2b8._2_2_ = (undefined2)((ulong)uVar22 >> 0x10);
            local_2b8[4] = (undefined1)((ulong)uVar22 >> 0x20);
            local_2b8._5_2_ = (undefined2)((ulong)uVar22 >> 0x28);
            local_2b8[7] = (undefined1)((ulong)uVar22 >> 0x38);
            local_2c8._0_8_ = (char *)*puVar10;
          }
          local_2c8._8_8_ = puVar10[1];
          *puVar10 = pcVar23;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          Stress::anon_unknown_0::LongShaderGenerator::addLine(local_3c0,(string *)local_2c8);
        }
        else {
          local_3e0._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3e0,local_338._M_dataplus._M_p,
                     local_338._M_dataplus._M_p + local_338._M_string_length);
          std::__cxx11::string::append((char *)&local_3e0);
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_318);
          local_370._0_8_ = local_370 + 0x10;
          plVar12 = puVar10 + 2;
          if ((long *)*puVar10 == plVar12) {
            local_370._16_8_ = *plVar12;
            local_370._24_8_ = puVar10[3];
          }
          else {
            local_370._16_8_ = *plVar12;
            local_370._0_8_ = (long *)*puVar10;
          }
          local_370._8_8_ = puVar10[1];
          *puVar10 = plVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append(local_370);
          local_2c8._0_8_ = local_2b8;
          pcVar23 = (char *)(puVar10 + 2);
          if ((char *)*puVar10 == pcVar23) {
            uVar22 = *(undefined8 *)pcVar23;
            local_2b8._0_2_ = (undefined2)uVar22;
            local_2b8._2_2_ = (undefined2)((ulong)uVar22 >> 0x10);
            local_2b8[4] = (undefined1)((ulong)uVar22 >> 0x20);
            local_2b8._5_2_ = (undefined2)((ulong)uVar22 >> 0x28);
            local_2b8[7] = (undefined1)((ulong)uVar22 >> 0x38);
            local_2b8._8_7_ = (undefined7)puVar10[3];
            local_2b8[0xf] = (undefined1)((ulong)puVar10[3] >> 0x38);
          }
          else {
            uVar22 = *(undefined8 *)pcVar23;
            local_2b8._0_2_ = (undefined2)uVar22;
            local_2b8._2_2_ = (undefined2)((ulong)uVar22 >> 0x10);
            local_2b8[4] = (undefined1)((ulong)uVar22 >> 0x20);
            local_2b8._5_2_ = (undefined2)((ulong)uVar22 >> 0x28);
            local_2b8[7] = (undefined1)((ulong)uVar22 >> 0x38);
            local_2c8._0_8_ = (char *)*puVar10;
          }
          local_2c8._8_8_ = puVar10[1];
          *puVar10 = pcVar23;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          Stress::anon_unknown_0::LongShaderGenerator::addLine(local_3c0,(string *)local_2c8);
        }
        if ((undefined1 *)local_2c8._0_8_ != local_2b8) {
          operator_delete((void *)local_2c8._0_8_,
                          CONCAT17(local_2b8[7],
                                   CONCAT25(local_2b8._5_2_,
                                            CONCAT14(local_2b8[4],
                                                     CONCAT22(local_2b8._2_2_,local_2b8._0_2_)))) +
                          1);
        }
        if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
          operator_delete((void *)local_370._0_8_,(ulong)(local_370._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e0._M_dataplus._M_p != paVar4) {
          operator_delete(local_3e0._M_dataplus._M_p,
                          (ulong)(local_3e0.field_2._M_allocated_capacity + 1));
        }
        if (local_318 != &local_308) {
          operator_delete(local_318,CONCAT71(uStack_307,local_308) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,
                          (ulong)(local_338.field_2._M_allocated_capacity + 1));
        }
        fVar25 = (float)(local_340->m_gen).m_spec.opsTotal;
        uVar17 = (ulong)(dVar19 + (int)local_148);
      } while (dVar19 + (int)local_148 < (uint)fVar25);
    }
    in_RCX = local_340;
    this = local_340;
    if ((local_340->m_gen).m_scopes.
        super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (local_340->m_gen).m_scopes.
        super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pLVar8 = &local_340->m_gen;
      do {
        pLVar9 = local_340;
        in_RCX = (LongShaderCompileStressCase *)
                 (local_340->m_gen).m_varNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             (local_340->m_gen).m_varNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&pLVar8->m_varNames,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((((ulong)((long)__last._M_current - (long)in_RCX) >> 5) -
                    (local_340->m_gen).m_scopes.
                    super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t._M_impl.
                    super__Rb_tree_header._M_node_count) * 0x20 + (long)in_RCX),__last);
        piVar1 = &(pLVar9->m_gen).m_nameGen.m_currentScopeDepth;
        *piVar1 = *piVar1 + -1;
        this_00 = &(pLVar9->m_gen).m_scopes.
                   super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t;
        (pLVar9->m_gen).m_scopes.
        super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_00;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(this_00);
        local_2b8._0_2_ = 0x7d;
        local_2c8._8_8_ = &DAT_00000001;
        local_2c8._0_8_ = local_2b8;
        Stress::anon_unknown_0::LongShaderGenerator::addLine(local_3c0,(string *)local_2c8);
        if ((undefined1 *)local_2c8._0_8_ != local_2b8) {
          operator_delete((void *)local_2c8._0_8_,
                          CONCAT17(local_2b8[7],
                                   CONCAT25(local_2b8._5_2_,
                                            CONCAT14(local_2b8[4],
                                                     CONCAT22(local_2b8._2_2_,local_2b8._0_2_)))) +
                          1);
        }
        this = local_340;
      } while ((local_340->m_gen).m_scopes.
               super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (local_340->m_gen).m_scopes.
               super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  local_128[0] = (this->m_gen).m_spec.shaderType;
  pcVar7 = (this->m_gen).m_source._M_dataplus._M_p;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,pcVar7,pcVar7 + (this->m_gen).m_source._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + local_128[0],&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  pcVar23 = "#version 300 es\nvoid main ()\n{\n\tgl_Position = vec4(0.0);\n}\n";
  if (local_2cc == SHADERTYPE_VERTEX) {
    pcVar23 = 
    "#version 300 es\nlayout(location = 0) out mediump vec4 o_fragColor;\nvoid main ()\n{\n\to_fragColor = vec4(0.0);\n}\n"
    ;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_370,pcVar23,(allocator<char> *)local_128);
  uVar22 = local_2c8._0_8_;
  siglen = CONCAT71((int7)((ulong)in_RCX >> 8),bVar27);
  local_2c8._1_3_ = 0;
  local_2c8[0] = bVar27;
  local_2c8._4_4_ = SUB84(uVar22,4);
  local_2c8._8_8_ = local_2b8 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2c8 + 8),local_370._0_8_,(pointer)(local_370._0_8_ + local_370._8_8_))
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + (local_2c8._0_8_ & 0xffffffff),(value_type *)(local_2c8 + 8));
  if ((undefined1 *)local_2c8._8_8_ != local_2b8 + 8) {
    operator_delete((void *)local_2c8._8_8_,CONCAT17(local_2b8[0xf],local_2b8._8_7_) + 1);
  }
  if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
    operator_delete((void *)local_370._0_8_,(ulong)(local_370._16_8_ + 1));
  }
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_2c8,((this->super_TestCase).m_context)->m_renderCtx,&local_100);
  verify(this,(EVP_PKEY_CTX *)local_2c8,sig,siglen,(uchar *)in_R8,in_R9);
  glu::operator<<(local_150,(ShaderProgram *)local_2c8);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar20 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar20));
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x18);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult LongShaderCompileStressCase::iterate (void)
{
	tcu::TestLog&				log			= m_testCtx.getLog();
	const glu::ShaderType		otherShader	= (m_shaderType == glu::SHADERTYPE_VERTEX) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;
	glu::ProgramSources			sources;

	sources << m_gen.getSource();
	sources << glu::ShaderSource(otherShader, getConstShaderSource(otherShader));

	{
		glu::ShaderProgram program(m_context.getRenderContext(), sources);

		verify(program);

		log << program;
	}

	return STOP;
}